

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

StandAloneFreeListPolicy * Memory::StandAloneFreeListPolicy::NewInternal(uint entries)

{
  HeapAllocator *this;
  StandAloneFreeListPolicy *pSVar1;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)entries * 0x10 + 0x100);
  local_48 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7c47a;
  data.filename._0_4_ = 0x3c5;
  this = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,(TrackAllocData *)local_48);
  pSVar1 = (StandAloneFreeListPolicy *)
           HeapAllocator::NoThrowAllocZero(this,(ulong)entries * 0x10 + 0x120);
  pSVar1->allocated = 0;
  pSVar1->used = 0;
  *(undefined8 *)&pSVar1->freeList = 0;
  pSVar1->allocated = entries;
  pSVar1->freeObjectLists = &pSVar1[1].allocated;
  pSVar1->entries = (FreeObjectListEntry *)(pSVar1 + 9);
  return pSVar1;
}

Assistant:

StandAloneFreeListPolicy * StandAloneFreeListPolicy::NewInternal(uint entries)
{
    size_t plusSize = buckets * sizeof(uint) + entries * sizeof(FreeObjectListEntry);
    StandAloneFreeListPolicy * _this = HeapNewNoThrowPlusZ(plusSize, StandAloneFreeListPolicy);

    if (NULL != _this)
    {
        _this->allocated = entries;
        _this->freeObjectLists = (uint *)(_this + 1);
        _this->entries = (FreeObjectListEntry *)(_this->freeObjectLists + buckets);
    }

    return _this;
}